

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O1

_Bool source_can_light_wall(chunk_conflict *c,player *p,loc_conflict sgrid,loc_conflict wgrid)

{
  _Bool _Var1;
  wchar_t wVar2;
  loc grid1;
  loc lVar3;
  ulong uVar4;
  _Bool _Var5;
  
  wVar2 = motion_dir((loc)wgrid,(loc)sgrid);
  grid1 = next_grid((loc)wgrid,wVar2);
  _Var1 = loc_eq((loc_conflict)grid1,wgrid);
  _Var5 = true;
  if (!_Var1) {
    lVar3.x = (p->grid).x;
    lVar3.y = (p->grid).y;
    wVar2 = motion_dir((loc)wgrid,lVar3);
    lVar3 = next_grid((loc)wgrid,wVar2);
    _Var1 = loc_eq((loc_conflict)lVar3,wgrid);
    if (!_Var1) {
      uVar4 = (ulong)grid1 >> 0x20;
      if (grid1.x == lVar3.x) {
        if (grid1.y != lVar3.y) {
          uVar4 = (ulong)wgrid >> 0x20;
          wgrid = (loc_conflict)grid1;
LAB_0012c4b8:
          _Var1 = square_allowslos(c,(loc)((ulong)wgrid & 0xffffffff | uVar4 << 0x20));
          return _Var1;
        }
      }
      else {
        if (grid1.y == lVar3.y) goto LAB_0012c4b8;
        _Var5 = false;
      }
    }
  }
  return _Var5;
}

Assistant:

static bool source_can_light_wall(struct chunk *c, struct player *p,
		struct loc sgrid, struct loc wgrid)
{
	struct loc sn = next_grid(wgrid, motion_dir(wgrid, sgrid)), pn, cn;

	/*
	 * If the light source is coincident with the wall, all faces will be
	 * lit, and the player can potentially see it if it's within range and
	 * the line of sight isn't broken.
	 */
	if (loc_eq(sn, wgrid)) return true;

	/*
	 * If the player is coincident with the wall, all faces of the wall are
	 * visible to the player and the player can see whichever of those is
	 * lit by the light source.
	 */
	pn = next_grid(wgrid, motion_dir(wgrid, p->grid));
	if (loc_eq(pn, wgrid)) return true;

	/*
	 * For the lit face of the wall to be visible to the player, the
	 * view directions from the wall to the player and the wall to the
	 * light source must share at least one component.
	 */
	if (sn.x == pn.x) {
		/*
		 * If the view directions share both components, the lit face
		 * will be visible to the player if in range and the line of
		 * sight isn't broken.
		 */
		if (sn.y == pn.y) return true;
		cn.x = sn.x;
		cn.y = wgrid.y;
	} else if (sn.y == pn.y) {
		cn.x = wgrid.x;
		cn.y = sn.y;
	} else {
		/*
		 * If the view directions don't share a component, the lit face
		 * is not visible to the player.
		 */
		return false;
	}

	/*
	 * When only one component of the view directions is shared, take the
	 * common component and test whether there's a wall there that would
	 * block the player's view of the lit face.  That prevents instances
	 * like this:
	 *  p
	 * ###1#
	 *  @
	 * where both the light-emitting monster, 'p', and the player, '@',
	 * have line of sight to the wall, '1', but the face of '1' that would
	 * be lit is blocked by the wall immediately to the left of '1'.
	 */
	return square_allowslos(c, cn);
}